

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastInstancesIterator::
findNextLeaf(FastInstancesIterator *this)

{
  TermList nodeTerm;
  TermList nodeTerm_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  NodeAlgorithm *pNVar5;
  Node *pNVar6;
  TermList *pTVar7;
  Node **in_RDI;
  uint specVar;
  Node *alts_1;
  Node **alts;
  NodeAlgorithm parentType;
  void *currAlt;
  uint currSpecVar;
  bool sibilingsRemain;
  Node *curr;
  Node **in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint uVar8;
  VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *obj;
  undefined4 in_stack_ffffffffffffff80;
  uint specVar_00;
  InstMatcher *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar9;
  undefined1 local_60 [8];
  uint64_t local_58;
  undefined4 local_4c;
  uint64_t local_48;
  Node *local_40;
  Node **local_38;
  NodeAlgorithm local_2c;
  Node *local_28;
  uint local_20;
  bool local_19;
  Node *local_18;
  Node **ppNVar10;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_19 = false;
  ppNVar10 = in_RDI;
  if (((ulong)*in_RDI & 0x100) == 0) {
    if (in_RDI[0x16] != (Node *)0x0) {
      local_18 = in_RDI[0x16];
      in_RDI[0x16] = (Node *)0x0;
      local_19 = enterNode((FastInstancesIterator *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
      goto LAB_003d2c12;
    }
  }
  else {
    bVar1 = Lib::Stack<void_*>::isEmpty((Stack<void_*> *)(in_RDI + 0x17));
    if (!bVar1) {
      SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::backtrack
                ((InstMatcher *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      *(undefined1 *)((long)in_RDI + 1) = 0;
      local_18 = (Node *)0x0;
LAB_003d2c12:
      do {
        local_20 = 0;
        if (local_18 != (Node *)0x0) {
          if ((local_19 & 1U) == 0) {
            local_20 = Lib::Stack<unsigned_int>::pop((Stack<unsigned_int> *)(in_RDI + 0x1b));
          }
          else {
            puVar4 = Lib::Stack<unsigned_int>::top((Stack<unsigned_int> *)(in_RDI + 0x1b));
            local_20 = *puVar4;
          }
        }
        while( true ) {
          uVar9 = false;
          if (local_18 == (Node *)0x0) {
            uVar9 = Lib::Stack<void_*>::isNonEmpty((Stack<void_*> *)(in_RDI + 0x17));
          }
          if ((bool)uVar9 == false) goto LAB_003d2e17;
          local_28 = (Node *)Lib::Stack<void_*>::pop((Stack<void_*> *)(in_RDI + 0x17));
          if (local_28 != (Node *)0x0) break;
          Lib::
          Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>::
          pop((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>
               *)(in_RDI + 0x1f));
          Lib::Stack<unsigned_int>::pop((Stack<unsigned_int> *)(in_RDI + 0x1b));
          bVar1 = Lib::Stack<void_*>::isNonEmpty((Stack<void_*> *)(in_RDI + 0x17));
          if (bVar1) {
            SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::backtrack
                      ((InstMatcher *)CONCAT17(uVar9,in_stack_ffffffffffffff90));
          }
        }
        pNVar5 = Lib::
                 Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>
                 ::top((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>
                        *)(in_RDI + 0x1f));
        local_2c = *pNVar5;
        if (local_2c == UNSORTED_LIST) {
          local_38 = local_28->nodes;
          local_18 = local_28->value;
          bVar1 = *local_38 == (Node *)0x0;
          if (!bVar1) {
            Lib::Stack<void_*>::push
                      ((Stack<void_*> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68);
          }
        }
        else {
          local_40 = local_28;
          local_18 = Lib::
                     SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
                     ::Node::head(local_28);
          pNVar6 = Lib::
                   SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
                   ::Node::tail(local_40);
          bVar1 = pNVar6 == (Node *)0x0;
          if (!bVar1) {
            in_stack_ffffffffffffff88 = (InstMatcher *)(in_RDI + 0x17);
            Lib::
            SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
            ::Node::tail(local_40);
            Lib::Stack<void_*>::push
                      ((Stack<void_*> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68);
          }
        }
        local_19 = !bVar1;
        if (local_19) {
          puVar4 = Lib::Stack<unsigned_int>::top((Stack<unsigned_int> *)(in_RDI + 0x1b));
          local_20 = *puVar4;
        }
        else {
          Lib::
          Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>::
          pop((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>
               *)(in_RDI + 0x1f));
          local_20 = Lib::Stack<unsigned_int>::pop((Stack<unsigned_int> *)(in_RDI + 0x1b));
        }
LAB_003d2e17:
        if (local_18 == (Node *)0x0) {
          return false;
        }
        obj = (VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)(in_RDI + 2);
        specVar_00 = local_20;
        pTVar7 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node::term(local_18);
        local_48 = pTVar7->_content;
        nodeTerm._content._7_1_ = uVar9;
        nodeTerm._content._0_7_ = in_stack_ffffffffffffff90;
        bVar1 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::matchNext
                          (in_stack_ffffffffffffff88,specVar_00,nodeTerm,
                           SUB41((uint)in_stack_ffffffffffffff80 >> 0x18,0));
        if (!bVar1) {
          local_18 = (Node *)0x0;
          if (((local_19 & 1U) == 0) &&
             (bVar1 = Lib::Stack<void_*>::isNonEmpty((Stack<void_*> *)(in_RDI + 0x17)), bVar1)) {
            SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::backtrack
                      ((InstMatcher *)CONCAT17(uVar9,in_stack_ffffffffffffff90));
          }
          goto LAB_003d2c12;
        }
        do {
          uVar2 = (*local_18->_vptr_Node[2])();
          uVar8 = in_stack_ffffffffffffff74 & 0xffffff;
          in_stack_ffffffffffffff74 = uVar8;
          if ((uVar2 & 1) == 0) {
            iVar3 = (*local_18->_vptr_Node[5])();
            in_stack_ffffffffffffff74 = uVar8 & 0xffffff;
            if (iVar3 == 1) {
              in_stack_ffffffffffffff74 =
                   CONCAT13(*(int *)((long)&local_18[1]._vptr_Node + 4) == 1,(int3)uVar8);
            }
          }
          if ((char)(in_stack_ffffffffffffff74 >> 0x18) == '\0') {
            uVar2 = (*local_18->_vptr_Node[2])();
            if ((uVar2 & 1) != 0) {
              (*local_18->_vptr_Node[8])(local_60);
              Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::operator=
                        ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)
                         CONCAT44(specVar_00,in_stack_ffffffffffffff80),obj);
              Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::~VirtualIterator
                        ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
              *(undefined1 *)((long)in_RDI + 1) = 1;
              SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::onLeafEntered
                        ((InstMatcher *)0x3d300c);
              return true;
            }
            local_19 = enterNode((FastInstancesIterator *)
                                 CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                 ppNVar10);
            if ((local_18 == (Node *)0x0) &&
               (bVar1 = Lib::Stack<void_*>::isNonEmpty((Stack<void_*> *)(in_RDI + 0x17)), bVar1)) {
              SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::backtrack
                        ((InstMatcher *)CONCAT17(uVar9,in_stack_ffffffffffffff90));
            }
            goto LAB_003d2c12;
          }
          in_stack_ffffffffffffff70 = *(undefined4 *)&local_18[1]._vptr_Node;
          local_18 = (Node *)local_18[1]._term._content;
          in_stack_ffffffffffffff68 = in_RDI + 2;
          local_4c = in_stack_ffffffffffffff70;
          pTVar7 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node::term(local_18);
          local_58 = pTVar7->_content;
          nodeTerm_00._content._7_1_ = uVar9;
          nodeTerm_00._content._0_7_ = in_stack_ffffffffffffff90;
          bVar1 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::matchNext
                            (in_stack_ffffffffffffff88,specVar_00,nodeTerm_00,
                             SUB41((uint)in_stack_ffffffffffffff80 >> 0x18,0));
        } while (bVar1);
        if (((local_19 & 1U) != 0) ||
           (bVar1 = Lib::Stack<void_*>::isNonEmpty((Stack<void_*> *)(in_RDI + 0x17)), bVar1)) {
          SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::backtrack
                    ((InstMatcher *)CONCAT17(uVar9,in_stack_ffffffffffffff90));
        }
        local_18 = (Node *)0x0;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastInstancesIterator::findNextLeaf()
{
  Node* curr;
  bool sibilingsRemain = false;
  if(_inLeaf) {
    if(_alternatives.isEmpty()) {
      return false;
    }
    _subst.backtrack();
    _inLeaf=false;
    curr=0;
  } else {
    if(!_root) {
      //If we aren't in a leaf and the findNextLeaf method has already been called,
      //it means that we're out of leafs.
      return false;
    }
    curr=_root;
    _root=0;
    sibilingsRemain=enterNode(curr);
  }
  for(;;) {
main_loop_start:
    unsigned currSpecVar = 0;

    if(curr) {
      if(sibilingsRemain) {
        ASS(_nodeTypes.top()!=UNSORTED_LIST || *static_cast<Node**>(_alternatives.top()));
        currSpecVar = _specVarNumbers.top();
      } else {
	      currSpecVar = _specVarNumbers.pop();
      }
    }
    //let's find a node we haven't been to...
    while(curr==0 && _alternatives.isNonEmpty()) {
      void* currAlt=_alternatives.pop();
      if(!currAlt) {
        //there's no alternative at this level, we have to backtrack
        _nodeTypes.pop();
        _specVarNumbers.pop();
        if(_alternatives.isNonEmpty()) {
	  _subst.backtrack();
	}
	continue;
      }

      NodeAlgorithm parentType = _nodeTypes.top();

      //the fact that we have alternatives means that here we are
      //matching by a variable (as there is always at most one child
      //for matching by term)
      if(parentType==UNSORTED_LIST) {
	Node** alts=static_cast<Node**>(currAlt);
	curr=*(alts++);
	if(*alts) {
	  _alternatives.push(alts);
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      } else {
	ASS_EQ(parentType,SKIP_LIST)
	auto alts = static_cast<typename SListIntermediateNode::NodeSkipList::Node *>(currAlt);
	ASS(alts);

	curr=alts->head();
	if(alts->tail()) {
	  _alternatives.push(alts->tail());
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      }

      if(sibilingsRemain) {
        currSpecVar = _specVarNumbers.top();
      } else {
        _nodeTypes.pop();
        currSpecVar = _specVarNumbers.pop();
      }
      ASS(curr);
      break;
    }
    if(!curr) {
      //there are no other alternatives
      return false;
    }
    if(!_subst.matchNext(currSpecVar, curr->term(), sibilingsRemain)) {	//[1]
      //match unsuccessful, try next alternative
      curr=0;
      if(!sibilingsRemain && _alternatives.isNonEmpty()) {
	_subst.backtrack();
      }
      continue;
    }
    while(!curr->isLeaf() && curr->algorithm()==UNSORTED_LIST && static_cast<UArrIntermediateNode*>(curr)->_size==1) {
      //a node with only one child, we don't need to bother with backtracking here.
      unsigned specVar=static_cast<UArrIntermediateNode*>(curr)->childVar;
      curr=static_cast<UArrIntermediateNode*>(curr)->_nodes[0];
      ASS(curr);
      if(!_subst.matchNext(specVar, curr->term(), false)) {
	//matching failed, let's go back to the node, that had multiple children
	//_subst.backtrack();
	if(sibilingsRemain || _alternatives.isNonEmpty()) {
	  //this backtrack can happen for two different reasons and have two different meanings:
	  //either matching at [1] was separated from the previous one and we're backtracking it,
	  //or it was not, which means it had no sibilings and we're backtracking from its parent.
	  _subst.backtrack();
	}
        curr=0;
        goto main_loop_start;
      }
    }
    if(curr->isLeaf()) {
      //we've found a leaf
      _ldIterator=static_cast<Leaf*>(curr)->allChildren();
      _inLeaf=true;
      _subst.onLeafEntered(); //we reset the bindings cache
      return true;
    }

    //let's go to the first child
    sibilingsRemain=enterNode(curr);
    if(curr==0 && _alternatives.isNonEmpty()) {
      _subst.backtrack();
    }
  }
}